

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O2

int ccm_auth_crypt(mbedtls_ccm_context *ctx,int mode,size_t length,uchar *iv,size_t iv_len,
                  uchar *add,size_t add_len,uchar *input,uchar *output,uchar *tag,size_t tag_len)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong __n;
  size_t sVar7;
  ulong uVar8;
  uchar *puVar9;
  undefined8 local_b8;
  undefined8 uStack_b0;
  int local_9c;
  mbedtls_cipher_context_t *local_98;
  size_t olen;
  uchar y [16];
  uchar ctr [16];
  
  iVar2 = -0xd;
  if ((((add_len < 0xff01) && (0xfffffffffffffff8 < iv_len - 0xe)) &&
      (0xfffffffffffffff2 < tag_len - 0x11)) && ((tag_len & 1) == 0)) {
    __n = (ulong)(byte)(-(char)iv_len + 0xf);
    bVar1 = -(char)iv_len + 0xe;
    local_b8 = CONCAT71(local_b8._1_7_,
                        (add_len != 0) << 6 | (char)tag_len * '\x04' - 8U & 0xf8 | bVar1);
    local_9c = mode;
    memcpy((void *)((long)&local_b8 + 1),iv,iv_len);
    sVar5 = length;
    for (lVar3 = 0; -lVar3 != __n; lVar3 = lVar3 + -1) {
      *(char *)((long)&uStack_b0 + lVar3 + 7) = (char)sVar5;
      sVar5 = sVar5 >> 8;
    }
    if (sVar5 == 0) {
      y[0] = '\0';
      y[1] = '\0';
      y[2] = '\0';
      y[3] = '\0';
      y[4] = '\0';
      y[5] = '\0';
      y[6] = '\0';
      y[7] = '\0';
      y[8] = '\0';
      y[9] = '\0';
      y[10] = '\0';
      y[0xb] = '\0';
      y[0xc] = '\0';
      y[0xd] = '\0';
      y[0xe] = '\0';
      y[0xf] = '\0';
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
        y[lVar3] = y[lVar3] ^ *(byte *)((long)&local_b8 + lVar3);
      }
      iVar2 = mbedtls_cipher_update(&ctx->cipher_ctx,y,0x10,y,&olen);
      if (iVar2 == 0) {
        local_98 = &ctx->cipher_ctx;
        if (add_len != 0) {
          uStack_b0 = 0;
          local_b8 = (ulong)CONCAT11((char)add_len,(char)(add_len >> 8));
          sVar7 = 0xe;
          if (add_len < 0xe) {
            sVar7 = add_len;
          }
          memcpy((void *)((long)&local_b8 + 2),add,sVar7);
          uVar8 = add_len - sVar7;
          for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
            y[lVar3] = y[lVar3] ^ *(byte *)((long)&local_b8 + lVar3);
          }
          iVar2 = mbedtls_cipher_update(local_98,y,0x10,y,&olen);
          if (iVar2 != 0) {
            return iVar2;
          }
          puVar9 = add + sVar7;
          for (; uVar8 != 0; uVar8 = uVar8 - sVar7) {
            sVar7 = 0x10;
            if (uVar8 < 0x10) {
              sVar7 = uVar8;
            }
            sVar6 = 0x10 - sVar7;
            if (0xf < uVar8) {
              sVar6 = 0;
            }
            memset((void *)((long)&local_b8 + sVar7),0,sVar6);
            memcpy(&local_b8,puVar9,sVar7);
            for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
              y[lVar3] = y[lVar3] ^ *(byte *)((long)&local_b8 + lVar3);
            }
            iVar2 = mbedtls_cipher_update(local_98,y,0x10,y,&olen);
            if (iVar2 != 0) {
              return iVar2;
            }
            puVar9 = puVar9 + sVar7;
          }
        }
        ctr[0] = bVar1;
        memcpy(ctr + 1,iv,iv_len);
        memset(ctr + iv_len + 1,0,__n);
        ctr[0xf] = '\x01';
LAB_00138643:
        if (length != 0) {
          sVar7 = 0x10;
          if (length < 0x10) {
            sVar7 = length;
          }
          if (local_9c == 0) {
            sVar6 = 0x10 - sVar7;
            if (0xf < length) {
              sVar6 = 0;
            }
            memset((void *)((long)&local_b8 + sVar7),0,sVar6);
            memcpy(&local_b8,input,sVar7);
            for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
              y[lVar3] = y[lVar3] ^ *(byte *)((long)&local_b8 + lVar3);
            }
            iVar2 = mbedtls_cipher_update(local_98,y,0x10,y,&olen);
            if (iVar2 != 0) {
              return iVar2;
            }
          }
          iVar2 = mbedtls_cipher_update(local_98,ctr,0x10,(uchar *)&local_b8,&olen);
          if (iVar2 != 0) {
            return iVar2;
          }
          for (lVar3 = 0; (byte)lVar3 < (byte)sVar7; lVar3 = lVar3 + 1) {
            output[lVar3] = *(byte *)((long)&local_b8 + lVar3) ^ input[lVar3];
          }
          if (local_9c == 1) {
            sVar6 = 0x10 - sVar7;
            if (0xf < length) {
              sVar6 = 0;
            }
            memset((void *)((long)&local_b8 + sVar7),0,sVar6);
            memcpy(&local_b8,output,sVar7);
            for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
              y[lVar3] = y[lVar3] ^ *(byte *)((long)&local_b8 + lVar3);
            }
            iVar2 = mbedtls_cipher_update(local_98,y,0x10,y,&olen);
            if (iVar2 != 0) {
              return iVar2;
            }
          }
          output = output + sVar7;
          input = input + sVar7;
          length = length - sVar7;
          uVar8 = 0xf;
          do {
            if (__n + uVar8 == 0xf) break;
            uVar4 = uVar8 & 0xffffffff;
            uVar8 = uVar8 - 1;
            puVar9 = ctr + uVar4;
            *puVar9 = *puVar9 + '\x01';
          } while (*puVar9 == '\0');
          goto LAB_00138643;
        }
        for (uVar8 = 0xf; __n + uVar8 != 0xf; uVar8 = uVar8 - 1) {
          ctr[uVar8 & 0xffffffff] = '\0';
        }
        iVar2 = mbedtls_cipher_update(local_98,ctr,0x10,(uchar *)&local_b8,&olen);
        if (iVar2 == 0) {
          for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
            y[lVar3] = y[lVar3] ^ *(byte *)((long)&local_b8 + lVar3);
          }
          memcpy(tag,y,tag_len);
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int ccm_auth_crypt( mbedtls_ccm_context *ctx, int mode, size_t length,
                           const unsigned char *iv, size_t iv_len,
                           const unsigned char *add, size_t add_len,
                           const unsigned char *input, unsigned char *output,
                           unsigned char *tag, size_t tag_len )
{
    int ret;
    unsigned char i;
    unsigned char q;
    size_t len_left, olen;
    unsigned char b[16];
    unsigned char y[16];
    unsigned char ctr[16];
    const unsigned char *src;
    unsigned char *dst;

    /*
     * Check length requirements: SP800-38C A.1
     * Additional requirement: a < 2^16 - 2^8 to simplify the code.
     * 'length' checked later (when writing it to the first block)
     */
    if( tag_len < 4 || tag_len > 16 || tag_len % 2 != 0 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    /* Also implies q is within bounds */
    if( iv_len < 7 || iv_len > 13 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    if( add_len > 0xFF00 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    q = 16 - 1 - (unsigned char) iv_len;

    /*
     * First block B_0:
     * 0        .. 0        flags
     * 1        .. iv_len   nonce (aka iv)
     * iv_len+1 .. 15       length
     *
     * With flags as (bits):
     * 7        0
     * 6        add present?
     * 5 .. 3   (t - 2) / 2
     * 2 .. 0   q - 1
     */
    b[0] = 0;
    b[0] |= ( add_len > 0 ) << 6;
    b[0] |= ( ( tag_len - 2 ) / 2 ) << 3;
    b[0] |= q - 1;

    memcpy( b + 1, iv, iv_len );

    for( i = 0, len_left = length; i < q; i++, len_left >>= 8 )
        b[15-i] = (unsigned char)( len_left & 0xFF );

    if( len_left > 0 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );


    /* Start CBC-MAC with first block */
    memset( y, 0, 16 );
    UPDATE_CBC_MAC;

    /*
     * If there is additional data, update CBC-MAC with
     * add_len, add, 0 (padding to a block boundary)
     */
    if( add_len > 0 )
    {
        size_t use_len;
        len_left = add_len;
        src = add;

        memset( b, 0, 16 );
        b[0] = (unsigned char)( ( add_len >> 8 ) & 0xFF );
        b[1] = (unsigned char)( ( add_len      ) & 0xFF );

        use_len = len_left < 16 - 2 ? len_left : 16 - 2;
        memcpy( b + 2, src, use_len );
        len_left -= use_len;
        src += use_len;

        UPDATE_CBC_MAC;

        while( len_left > 0 )
        {
            use_len = len_left > 16 ? 16 : len_left;

            memset( b, 0, 16 );
            memcpy( b, src, use_len );
            UPDATE_CBC_MAC;

            len_left -= use_len;
            src += use_len;
        }
    }

    /*
     * Prepare counter block for encryption:
     * 0        .. 0        flags
     * 1        .. iv_len   nonce (aka iv)
     * iv_len+1 .. 15       counter (initially 1)
     *
     * With flags as (bits):
     * 7 .. 3   0
     * 2 .. 0   q - 1
     */
    ctr[0] = q - 1;
    memcpy( ctr + 1, iv, iv_len );
    memset( ctr + 1 + iv_len, 0, q );
    ctr[15] = 1;

    /*
     * Authenticate and {en,de}crypt the message.
     *
     * The only difference between encryption and decryption is
     * the respective order of authentication and {en,de}cryption.
     */
    len_left = length;
    src = input;
    dst = output;

    while( len_left > 0 )
    {
        size_t use_len = len_left > 16 ? 16 : len_left;

        if( mode == CCM_ENCRYPT )
        {
            memset( b, 0, 16 );
            memcpy( b, src, use_len );
            UPDATE_CBC_MAC;
        }

        CTR_CRYPT( dst, src, use_len );

        if( mode == CCM_DECRYPT )
        {
            memset( b, 0, 16 );
            memcpy( b, dst, use_len );
            UPDATE_CBC_MAC;
        }

        dst += use_len;
        src += use_len;
        len_left -= use_len;

        /*
         * Increment counter.
         * No need to check for overflow thanks to the length check above.
         */
        for( i = 0; i < q; i++ )
            if( ++ctr[15-i] != 0 )
                break;
    }

    /*
     * Authentication: reset counter and crypt/mask internal tag
     */
    for( i = 0; i < q; i++ )
        ctr[15-i] = 0;

    CTR_CRYPT( y, y, 16 );
    memcpy( tag, y, tag_len );

    return( 0 );
}